

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_property_behavior
               (nk_flags *ws,nk_input *in,nk_rect property,nk_rect label,nk_rect edit,nk_rect empty,
               int *state,nk_property_variant *variant,float inc_per_pixel)

{
  nk_rect r;
  nk_rect b;
  nk_rect b_00;
  nk_rect drag;
  nk_bool nVar1;
  nk_input *in_RCX;
  nk_input *in_RDX;
  long in_RSI;
  uint *in_RDI;
  nk_flags *in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  nk_input *in_XMM3_Qa;
  undefined8 in_XMM5_Qa;
  float in_XMM6_Da;
  undefined8 unaff_retaddr;
  nk_button_behavior in_stack_ffffffffffffff9c;
  undefined4 uVar2;
  float inc_per_pixel_00;
  nk_property_variant *variant_00;
  
  inc_per_pixel_00 = (float)((ulong)in_XMM5_Qa >> 0x20);
  variant_00 = (nk_property_variant *)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  uVar2 = (undefined4)((ulong)in_RSI >> 0x20);
  if ((in_RSI != 0) && ((in_RDX->keyboard).keys[0].down == 0)) {
    r._4_8_ = in_RDI;
    r.x = (float)uVar2;
    r.h = in_XMM6_Da;
    nVar1 = nk_button_behavior((nk_flags *)in_RDX,r,in_RCX,in_stack_ffffffffffffff9c);
    if (nVar1 == 0) {
      b._4_8_ = in_RDI;
      b.x = (float)uVar2;
      b.h = in_XMM6_Da;
      nVar1 = nk_input_is_mouse_click_down_in_rect
                        (in_RDX,(nk_buttons)((ulong)in_RCX >> 0x20),b,(nk_bool)in_RCX);
      if (nVar1 == 0) {
        b_00._4_8_ = in_RDI;
        b_00.x = (float)uVar2;
        b_00.h = in_XMM6_Da;
        nVar1 = nk_input_is_mouse_click_down_in_rect
                          (in_RDX,(nk_buttons)((ulong)in_RCX >> 0x20),b_00,(nk_bool)in_RCX);
        if (nVar1 != 0) {
          (in_RDX->keyboard).keys[0].down = 2;
        }
      }
      else {
        (in_RDX->keyboard).keys[0].down = 2;
      }
    }
    else {
      (in_RDX->keyboard).keys[0].down = 1;
    }
  }
  if (((in_RDX->keyboard).keys[0].down == 2) &&
     (drag._8_8_ = unaff_retaddr, drag.x = (float)(int)in_XMM1_Qa,
     drag.y = (float)(int)((ulong)in_XMM1_Qa >> 0x20),
     nk_drag_behavior(in_XMM0_Qa,in_XMM3_Qa,drag,variant_00,inc_per_pixel_00), (*in_RDI & 0x20) == 0
     )) {
    (in_RDX->keyboard).keys[0].down = 0;
  }
  return;
}

Assistant:

NK_LIB void
nk_property_behavior(nk_flags *ws, const struct nk_input *in,
struct nk_rect property,  struct nk_rect label, struct nk_rect edit,
struct nk_rect empty, int *state, struct nk_property_variant *variant,
float inc_per_pixel)
{
if (in && *state == NK_PROPERTY_DEFAULT) {
if (nk_button_behavior(ws, edit, in, NK_BUTTON_DEFAULT))
*state = NK_PROPERTY_EDIT;
else if (nk_input_is_mouse_click_down_in_rect(in, NK_BUTTON_LEFT, label, nk_true))
*state = NK_PROPERTY_DRAG;
else if (nk_input_is_mouse_click_down_in_rect(in, NK_BUTTON_LEFT, empty, nk_true))
*state = NK_PROPERTY_DRAG;
}
if (*state == NK_PROPERTY_DRAG) {
nk_drag_behavior(ws, in, property, variant, inc_per_pixel);
if (!(*ws & NK_WIDGET_STATE_ACTIVED)) *state = NK_PROPERTY_DEFAULT;
}
}